

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::FieldGeneratorBase
          (FieldGeneratorBase *this,FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  _Rb_tree_header *p_Var1;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__FieldGeneratorBase_004d9748;
  this->descriptor_ = descriptor;
  this->presenceIndex_ = presenceIndex;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SetCommonFieldVariables(this,&this->variables_);
  return;
}

Assistant:

FieldGeneratorBase::FieldGeneratorBase(const FieldDescriptor* descriptor,
                                       int presenceIndex, const Options* options)
    : SourceGeneratorBase(options),
      descriptor_(descriptor),
      presenceIndex_(presenceIndex) {
  SetCommonFieldVariables(&variables_);
}